

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadCord(CodedInputStream *this,Cord *output,int size)

{
  char *__str;
  byte bVar1;
  int iVar2;
  Cord **v1;
  void **v2;
  LogMessage *pLVar3;
  int *piVar4;
  size_type sVar5;
  undefined1 auVar6 [16];
  int available;
  int closest_limit;
  int local_84;
  undefined1 local_80 [8];
  string_view buffer;
  LogMessageFatal local_50 [23];
  Voidify local_39;
  void *local_38;
  string *local_30;
  string *absl_log_internal_check_op_result;
  Cord *pCStack_20;
  int size_local;
  Cord *output_local;
  CodedInputStream *this_local;
  
  absl_log_internal_check_op_result._4_4_ = size;
  pCStack_20 = output;
  output_local = (Cord *)this;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue<absl::lts_20240722::Cord*>
                 (&stack0xffffffffffffffe0);
  local_38 = (void *)0x0;
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_38);
  local_30 = absl::lts_20240722::log_internal::
             Check_NEImpl<absl::lts_20240722::Cord*,decltype(nullptr)>(v1,v2,"output != nullptr");
  if (local_30 != (string *)0x0) {
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
               ,0x133,auVar6._0_8_,auVar6._8_8_);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_50);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
  }
  if (absl_log_internal_check_op_result._4_4_ < 0) {
    absl::lts_20240722::Cord::Clear();
    return false;
  }
  if ((*(long *)(this + 0x10) == 0) || (absl_log_internal_check_op_result._4_4_ < 0x200)) {
    __str = *(char **)this;
    local_84 = BufferSize(this);
    piVar4 = std::min<int>((int *)((long)&absl_log_internal_check_op_result + 4),&local_84);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_80,__str,(long)*piVar4);
    absl::lts_20240722::Cord::operator=(pCStack_20,local_80,buffer._M_len);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_80);
    Advance(this,(int)sVar5);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_80);
    absl_log_internal_check_op_result._4_4_ = absl_log_internal_check_op_result._4_4_ - (int)sVar5;
    if (absl_log_internal_check_op_result._4_4_ == 0) {
      return true;
    }
    if ((*(long *)(this + 0x10) == 0) || (0 < *(int *)(this + 0x2c) + *(int *)(this + 0x1c))) {
      return false;
    }
  }
  else {
    absl::lts_20240722::Cord::Clear();
    BackUpInputToCurrentPosition(this);
  }
  piVar4 = std::min<int>((int *)(this + 0x28),(int *)(this + 0x30));
  iVar2 = *piVar4 - *(int *)(this + 0x18);
  if (iVar2 < absl_log_internal_check_op_result._4_4_) {
    *(int *)(this + 0x18) = *piVar4;
    (**(code **)(**(long **)(this + 0x10) + 0x30))(*(long **)(this + 0x10),pCStack_20,iVar2);
    this_local._7_1_ = false;
  }
  else {
    *(int *)(this + 0x18) = absl_log_internal_check_op_result._4_4_ + *(int *)(this + 0x18);
    bVar1 = (**(code **)(**(long **)(this + 0x10) + 0x30))
                      (*(long **)(this + 0x10),pCStack_20,absl_log_internal_check_op_result._4_4_);
    this_local._7_1_ = (bool)(bVar1 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool CodedInputStream::ReadCord(absl::Cord* output, int size) {
  ABSL_DCHECK_NE(output, nullptr);

  // security: size is often user-supplied
  if (size < 0) {
    output->Clear();
    return false;  // security: size is often user-supplied
  }

  // Grab whatever is in the current output if `size` is relatively small,
  // or if we are not sourcing data from an input stream.
  if (input_ == nullptr || size < kMaxCordBytesToCopy) {
    // Just copy the current buffer into the output rather than backing up.
    absl::string_view buffer(reinterpret_cast<const char*>(buffer_),
                             static_cast<size_t>(std::min(size, BufferSize())));
    *output = buffer;
    Advance(static_cast<int>(buffer.size()));
    size -= static_cast<int>(buffer.size());
    if (size == 0) return true;
    if (input_ == nullptr || buffer_size_after_limit_ + overflow_bytes_ > 0) {
      // We hit a limit.
      return false;
    }
  } else {
    output->Clear();
    BackUpInputToCurrentPosition();
  }

  // Make sure to not cross a limit set by PushLimit() or SetTotalBytesLimit().
  const int closest_limit = std::min(current_limit_, total_bytes_limit_);
  const int available = closest_limit - total_bytes_read_;
  if (PROTOBUF_PREDICT_FALSE(size > available)) {
    total_bytes_read_ = closest_limit;
    input_->ReadCord(output, available);
    return false;
  }
  total_bytes_read_ += size;
  return input_->ReadCord(output, size);
}